

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O2

optional<pbrt::ShapeIntersection> * __thiscall
pbrt::ShapeHandle::Intersect
          (optional<pbrt::ShapeIntersection> *__return_storage_ptr__,ShapeHandle *this,Ray *ray,
          Float tMax)

{
  anon_class_16_2_20c957dd func;
  Float local_c;
  
  func.tMax = &local_c;
  func.ray = ray;
  local_c = tMax;
  TaggedPointer<pbrt::Sphere,pbrt::Cylinder,pbrt::Disk,pbrt::Triangle,pbrt::BilinearPatch,pbrt::Curve>
  ::Dispatch<pbrt::ShapeHandle::Intersect(pbrt::Ray_const&,float)const::_lambda(auto:1)_1_>
            (__return_storage_ptr__,
             (TaggedPointer<pbrt::Sphere,pbrt::Cylinder,pbrt::Disk,pbrt::Triangle,pbrt::BilinearPatch,pbrt::Curve>
              *)this,func);
  return __return_storage_ptr__;
}

Assistant:

inline pstd::optional<ShapeIntersection> ShapeHandle::Intersect(const Ray &ray,
                                                                Float tMax) const {
    auto intr = [&](auto ptr) { return ptr->Intersect(ray, tMax); };
    return Dispatch(intr);
}